

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,_4U>::swizzle(ImageT<unsigned_short,_4U> *this,string_view swizzle)

{
  Color *pCVar1;
  ulong uVar2;
  unsigned_short uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t c;
  ulong uVar6;
  Color srcPixel;
  
  if (swizzle._M_len == 4) {
    for (uVar5 = 0; uVar5 < (this->super_Image).height * (this->super_Image).width;
        uVar5 = uVar5 + 1) {
      srcPixel.field_0 =
           (anon_union_8_2_6556a7fb_for_color<unsigned_short,_4U>_3)
           *(anon_union_8_2_6556a7fb_for_color<unsigned_short,_4U>_3 *)
            &this->pixels[uVar5].field_0.field_1;
      uVar6 = 0;
      while( true ) {
        uVar4 = (*(this->super_Image)._vptr_Image[5])(this);
        if (uVar4 <= uVar6) break;
        pCVar1 = this->pixels;
        uVar3 = swizzlePixel(this,&srcPixel,swizzle._M_str[uVar6]);
        uVar2 = 3;
        if ((uint)uVar6 < 3) {
          uVar2 = uVar6;
        }
        pCVar1[uVar5].field_0.comps[uVar2 & 0xffffffff] = uVar3;
        uVar6 = uVar6 + 1;
      }
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::swizzle(std::string_view) [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }